

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O1

string * readToken_abi_cxx11_(string *__return_storage_ptr__,char **pStart,char *pEnd,char sep)

{
  char *pcVar1;
  
  if (pEnd < *pStart) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pcVar1 = *pStart;
    while ((pcVar1 != pEnd && (*pcVar1 != sep))) {
      pcVar1 = pcVar1 + 1;
      *pStart = pcVar1;
    }
    *pStart = pcVar1 + 1;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string readToken (const char* &pStart, const char* pEnd, char sep = ',')
{
    // Safety check
    if (pStart > pEnd) return std::string();
    
    const char* pBegin = pStart;
    for (; pStart != pEnd && *pStart != sep; ++pStart);
    // eat separator
    ++pStart;
    return std::string(pBegin, size_t(pStart - pBegin -1));
}